

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

void voc_parse_disambig(voccxdef *ctx)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  runcxdef *ctx_00;
  runsdef *prVar4;
  objnum *poVar5;
  char cVar6;
  objnum oVar7;
  uint uVar8;
  uchar *puVar9;
  size_t sVar10;
  char *pcVar11;
  int *piVar12;
  uint16_t tmp_1;
  char *pcVar13;
  uchar uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint16_t tmp;
  vocoldef *pvVar20;
  errcxdef *ctx_01;
  ushort *puVar21;
  vocoldef *pvVar22;
  voccxdef *ctx_02;
  int iVar23;
  char **ppcVar24;
  int iVar25;
  char **ppcVar26;
  int iVar27;
  vocoldef *pvVar28;
  bool bVar29;
  uint local_1264;
  ushort *local_1260;
  uint subsiz;
  uchar local_1251;
  char **local_1250;
  vocoldef *local_1248;
  uint objsiz;
  objnum local_1236;
  ushort local_1234;
  objnum local_1232;
  objnum local_1230;
  objnum local_122e;
  objnum local_122c;
  prpnum local_122a;
  voccxdef *local_1228;
  vocoldef *local_1220;
  vocoldef *local_1218;
  char **local_1210;
  uchar *objp;
  char **local_1200;
  undefined8 local_11f8;
  voccxdef ctx_copy;
  
  pvVar28 = (vocoldef *)ctx->voc_stk_cur;
  pvVar20 = (vocoldef *)ctx->voc_stk_end;
  pvVar22 = pvVar28 + 200;
  if (pvVar22 <= pvVar20) {
    ctx_00 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)pvVar22;
    ppcVar24 = &pvVar28[0xcb].vocolfst;
    if (ppcVar24 <= pvVar20) {
      ctx->voc_stk_cur = (uchar *)ppcVar24;
      if (&pvVar28[0xce].vocollst <= pvVar20) {
        ctx->voc_stk_cur = (uchar *)&pvVar28[0xce].vocollst;
        prVar4 = ctx_00->runcxsp;
        ctx_00->runcxsp = prVar4 + -1;
        if (prVar4[-1].runstyp != '\x02') {
LAB_001f4fda:
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3f2);
        }
        local_122c = prVar4[-1].runsv.runsvobj;
        ctx_00->runcxsp = prVar4 + -2;
        if (prVar4[-2].runstyp != '\x02') goto LAB_001f4fda;
        local_122e = prVar4[-2].runsv.runsvobj;
        ctx_00->runcxsp = prVar4 + -3;
        local_1230 = 0xffff;
        local_1232 = 0xffff;
        if (prVar4[-3].runstyp != '\x05') {
          if (prVar4[-3].runstyp != '\x02') goto LAB_001f4fda;
          local_1232 = prVar4[-3].runsv.runsvobj;
        }
        ctx_00->runcxsp = prVar4 + -4;
        if (prVar4[-4].runstyp != '\x05') {
          if (prVar4[-4].runstyp != '\x02') goto LAB_001f4fda;
          local_1230 = prVar4[-4].runsv.runsvobj;
        }
        ctx_00->runcxsp = prVar4 + -5;
        if (prVar4[-5].runstyp != '\x01') {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3eb);
        }
        local_1234 = 10;
        if (prVar4[-5].runsv.runsvnum == 3) {
          local_122a = 0x29;
        }
        else {
          local_122a = 0x15;
          if (prVar4[-5].runsv.runsvnum == 2) {
            local_1234 = 0xb;
            local_122a = 0x16;
          }
        }
        ctx_00->runcxsp = prVar4 + -6;
        if (prVar4[-6].runstyp != '\r') {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3f4);
        }
        local_1236 = prVar4[-6].runsv.runsvobj;
        ctx_00->runcxsp = prVar4 + -7;
        local_1228 = ctx;
        local_1200 = ppcVar24;
        if (prVar4[-7].runstyp != '\a') {
LAB_001f4ff1:
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3fc);
        }
        puVar21 = (ushort *)prVar4[-7].runsv.runsvstr;
        uVar2 = *puVar21;
        ctx_00->runcxsp = prVar4 + -8;
        if (prVar4[-8].runstyp != '\a') goto LAB_001f4ff1;
        objsiz = *(ushort *)prVar4[-8].runsv.runsvstr - 2;
        objp = (uchar *)((long)prVar4[-8].runsv.runsvstr + 2);
        ctx_00->runcxsp = prVar4 + -9;
        local_1251 = prVar4[-9].runstyp;
        local_11f8 = 1;
        if ((local_1251 != '\b') && (local_11f8 = 0, local_1251 != '\x05')) {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3ed);
        }
        uVar15 = uVar2 - 2;
        puVar21 = puVar21 + 1;
        ppcVar24 = (char **)0x0;
        local_1264 = uVar15;
        local_1260 = puVar21;
        local_1248 = pvVar22;
        local_1220 = pvVar28;
        if (uVar15 != 0) {
          do {
            ppcVar24 = (char **)(ulong)((int)ppcVar24 + (uint)((char)*local_1260 == '\x03'));
            lstadv((uchar **)&local_1260,&local_1264);
          } while (local_1264 != 0);
        }
        local_1250 = (char **)local_1228->voc_stk_cur;
        puVar9 = (uchar *)((ulong)((int)ppcVar24 * 8 + 8) + (long)local_1250);
        if (local_1228->voc_stk_end < puVar9) {
          ctx_01 = local_1228->voccxerr;
          goto LAB_001f503f;
        }
        uVar18 = 0;
        local_1228->voc_stk_cur = puVar9;
        local_1264 = uVar15;
        local_1260 = puVar21;
        local_1210 = ppcVar24;
        if (uVar15 != 0) {
          pvVar22 = local_1248;
          do {
            if ((char)*local_1260 == '\x03') {
              iVar27 = (int)uVar18;
              uVar18 = (ulong)(iVar27 + 1);
              local_1250[iVar27] = (char *)pvVar22;
              uVar2 = *(ushort *)((long)local_1260 + 1);
              uVar19 = (ulong)(uVar2 - 2);
              memcpy(pvVar22,(char *)((long)local_1260 + 3),uVar19);
              *(uchar *)((long)&pvVar22->vocolobj + uVar19) = '\0';
              pvVar22 = (vocoldef *)((long)&pvVar22->vocolobj + (ulong)(uVar2 - 1));
            }
            lstadv((uchar **)&local_1260,&local_1264);
          } while (local_1264 != 0);
          uVar18 = (ulong)(int)uVar18;
        }
        local_1250[uVar18] = (char *)0x0;
        if (objsiz == 0) {
          local_1260 = (ushort *)objp;
          local_1264 = 0;
          uVar18 = 0x28;
        }
        else {
          if (*objp == '\x01') {
            lstadv(&objp,&objsiz);
            local_1260 = (ushort *)objp;
            local_1264 = objsiz;
            if (objsiz == 0) {
              uVar18 = 0x28;
              goto LAB_001f49e6;
            }
          }
          iVar27 = 0;
          local_1264 = objsiz;
          local_1260 = (ushort *)objp;
          do {
            if ((char)*local_1260 == '\a') {
              ctx_copy.voccxerr = (errcxdef *)((long)local_1260 + 3);
              subsiz = *(ushort *)((long)local_1260 + 1) - 2;
              while (subsiz != 0) {
                if ((*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') ||
                   (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02')) {
                  iVar27 = iVar27 + 1;
                }
                lstadv((uchar **)&ctx_copy,&subsiz);
              }
            }
            lstadv((uchar **)&local_1260,&local_1264);
          } while (local_1264 != 0);
          uVar18 = (ulong)(iVar27 * 0x28 + 0x28);
        }
LAB_001f49e6:
        local_1218 = (vocoldef *)local_1228->voc_stk_cur;
        puVar9 = (uchar *)((long)&local_1218->vocolobj + uVar18);
        if (local_1228->voc_stk_end < puVar9) {
          ctx_01 = local_1228->voccxerr;
          goto LAB_001f503f;
        }
        local_1228->voc_stk_cur = puVar9;
        local_1260 = (ushort *)objp;
        local_1264 = objsiz;
        if (objsiz == 0) {
          lVar17 = 0;
          iVar27 = 0;
        }
        else {
          iVar27 = 0;
          iVar25 = 0;
          do {
            if ((uchar)*local_1260 == '\a') {
              ctx_copy.voccxerr = (errcxdef *)((long)local_1260 + 3);
              subsiz = *(ushort *)((long)local_1260 + 1) - 2;
              if (subsiz != 0) {
                iVar23 = 0;
                if (*(uchar *)&(ctx_copy.voccxerr)->errcxptr == '\x01') {
                  iVar23 = *(int *)(local_1260 + 2) + -1;
                  if ((int)local_1210 <= iVar23) {
                    iVar23 = (int)local_1210;
                  }
                  if (*(int *)(local_1260 + 2) < 1) {
                    iVar23 = 0;
                  }
                  lstadv((uchar **)&ctx_copy,&subsiz);
                  if (subsiz == 0) goto LAB_001f4ba5;
                }
                if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x01') {
                  iVar3 = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                  iVar16 = iVar3 + -1;
                  if ((int)local_1210 <= iVar16) {
                    iVar16 = (int)local_1210;
                  }
                  if (iVar3 <= iVar23) {
                    iVar16 = iVar23;
                  }
                  lstadv((uchar **)&ctx_copy,&subsiz);
                  if (subsiz == 0) goto LAB_001f4ba5;
                  lVar17 = (long)iVar16;
                }
                else {
                  lVar17 = 0;
                }
                do {
                  if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') {
                    oVar7 = 0xffff;
LAB_001f4b0d:
                    pvVar22 = local_1218 + iVar25;
                    pvVar22->vocolobj = oVar7;
                    pvVar22->vocolfst = local_1250[iVar23];
                    pvVar22->vocollst = local_1250[lVar17];
                    lstadv((uchar **)&ctx_copy,&subsiz);
                    if ((subsiz == 0) || (*(char *)&(ctx_copy.voccxerr)->errcxptr != '\x01')) {
                      pvVar22->vocolflg = 0;
                      uVar8 = 0;
                    }
                    else {
                      pvVar22->vocolflg = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                      lstadv((uchar **)&ctx_copy,&subsiz);
                      uVar8 = (uint)pvVar22->vocolflg >> 0xb & 1;
                    }
                    iVar27 = iVar27 + uVar8;
                    iVar25 = iVar25 + 1;
                  }
                  else {
                    if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02') {
                      oVar7 = *(objnum *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                      goto LAB_001f4b0d;
                    }
                    lstadv((uchar **)&ctx_copy,&subsiz);
                  }
                } while (subsiz != 0);
              }
            }
LAB_001f4ba5:
            lstadv((uchar **)&local_1260,&local_1264);
          } while (local_1264 != 0);
          lVar17 = (long)iVar25;
        }
        pvVar28 = local_1218;
        ctx_02 = local_1228;
        local_1218[lVar17].vocolobj = 0xffff;
        local_1218[lVar17].vocolflg = 0;
        memcpy(&ctx_copy,local_1228,0x11c0);
        pvVar22 = local_1220;
        pcVar11 = (char *)(ulong)local_1234;
        ctx_copy.voccxunknown = iVar27;
        ctx_copy.voccxlastunk = iVar27;
        iVar27 = vocdisambig(&ctx_copy,local_1220,pvVar28,local_1234,local_122a,local_1236,
                             local_1250,local_1230,local_122c,local_122e,local_1232,
                             (char *)local_1248,(int)local_11f8);
        ppcVar24 = local_1200;
        if (((local_1251 == '\b') || (iVar27 != 2)) || (ctx_copy.voccxunknown == 0)) {
LAB_001f4e51:
          if ((iVar27 == 0x2c) || (uVar8 = 0, iVar27 == 0)) {
            uVar8 = 0xffffffff;
            pvVar28 = pvVar22;
            do {
              uVar8 = uVar8 + 1;
              poVar5 = &pvVar28->vocolobj;
              pvVar28 = pvVar28 + 1;
            } while (*poVar5 != 0xffff);
          }
        }
        else {
          ctx_copy.voccxunknown = 0;
          pcVar13 = *local_1250;
          if (pcVar13 != (char *)0x0) {
            uVar18 = 0;
            do {
              sVar10 = strlen(pcVar13);
              pcVar11 = (char *)0x1;
              iVar25 = voc_lookup_type(ctx_02,pcVar13,(int)sVar10,1);
              if (iVar25 == 0) {
                pcVar13 = local_1250[uVar18];
                if (pcVar13 != (char *)0x0) goto LAB_001f4cea;
                break;
              }
              pcVar13 = local_1250[uVar18 + 1];
              uVar18 = uVar18 + 1;
            } while (pcVar13 != (char *)0x0);
          }
          pcVar13 = *local_1250;
          uVar18 = 0;
LAB_001f4cea:
          local_1218 = (vocoldef *)voc_read_oops(&ctx_copy,(char *)ppcVar24,(size_t)pcVar13,pcVar11)
          ;
          if (local_1218 == (vocoldef *)0x0) {
            ctx_copy.voccxredo = 1;
            strcpy((char *)local_1248,(char *)ppcVar24);
            pvVar22 = local_1220;
            goto LAB_001f4e51;
          }
          pvVar22 = (vocoldef *)*local_1250;
          pvVar28 = local_1248;
          if (pvVar22 != (vocoldef *)0x0) {
            local_1210 = &local_1248[3].vocolfst;
            uVar19 = 0;
            ppcVar24 = local_1250;
            do {
              pvVar20 = pvVar22;
              if (uVar19 == (uVar18 & 0xffffffff)) {
                pvVar20 = local_1218;
              }
              sVar10 = strlen((char *)pvVar20);
              ppcVar26 = local_1250;
              if ((ulong)((long)local_1210 - (long)pvVar28) <
                  sVar10 + (sVar10 != 0 && ppcVar24[uVar19 + 1] != (char *)0x0) + 1) break;
              pvVar20 = local_1218;
              if ((uVar19 == (uVar18 & 0xffffffff)) ||
                 (pvVar20 = pvVar22, (char)pvVar22->vocolobj != '\"')) {
                strcpy((char *)pvVar28,(char *)pvVar20);
                ppcVar26 = local_1250;
              }
              else {
                pcVar11 = &pvVar22->field_0x2;
                cVar6 = *(char *)((long)&pvVar22->vocolobj + 1);
                do {
                  uVar14 = '\"';
                  if ((cVar6 == '\0') || (cVar1 = *pcVar11, cVar1 == '\0')) goto LAB_001f4da8;
                  pcVar11 = pcVar11 + 1;
                  bVar29 = cVar6 != '\"';
                  cVar6 = cVar1;
                } while (bVar29);
                uVar14 = '\'';
LAB_001f4da8:
                *(uchar *)&pvVar28->vocolobj = uVar14;
                puVar9 = (uchar *)((long)&pvVar28->vocolobj + 1);
                pcVar11 = local_1250[uVar19];
                sVar10 = strlen(pcVar11);
                if (2 < sVar10) {
                  memcpy(puVar9,pcVar11 + 1,sVar10 - 2);
                  sVar10 = strlen(ppcVar26[uVar19]);
                  puVar9 = puVar9 + (sVar10 - 2);
                }
                *puVar9 = uVar14;
                puVar9[1] = '\0';
                pvVar28 = (vocoldef *)(puVar9 + 1);
              }
              uVar19 = uVar19 + 1;
              sVar10 = strlen((char *)pvVar28);
              pvVar28 = (vocoldef *)((long)&pvVar28->vocolobj + sVar10);
              if (ppcVar26[uVar19] == (char *)0x0) break;
              *(uchar *)&pvVar28->vocolobj = ' ';
              pvVar28 = (vocoldef *)((long)&pvVar28->vocolobj + 1);
              pvVar22 = (vocoldef *)ppcVar26[uVar19];
              ppcVar24 = ppcVar26;
            } while (pvVar22 != (vocoldef *)0x0);
          }
          *(uchar *)&pvVar28->vocolobj = '\0';
          uVar8 = 0;
          iVar27 = 0x2d;
          ctx_02 = local_1228;
          pvVar22 = local_1220;
        }
        iVar25 = ctx_copy.voccxredo;
        local_1264 = uVar8 * 3 + 5;
        if (iVar27 == 0x2d || ctx_copy.voccxredo != 0) {
          sVar10 = strlen((char *)local_1248);
          local_1264 = uVar8 * 3 + (int)sVar10 + 8;
          pvVar22 = local_1220;
          if (iVar25 == 0) goto LAB_001f4f02;
          puVar9 = voc_push_list_siz(ctx_02,local_1264);
          piVar12 = (int *)(puVar9 + 1);
          *puVar9 = '\x01';
          *piVar12 = 0x2b;
          puVar9 = puVar9 + 5;
          iVar27 = 0x2b;
          pvVar22 = local_1220;
        }
        else {
LAB_001f4f02:
          puVar9 = voc_push_list_siz(ctx_02,local_1264);
          piVar12 = (int *)(puVar9 + 1);
          *puVar9 = '\x01';
          *piVar12 = iVar27;
          puVar9 = puVar9 + 5;
          if ((iVar27 == 0x2c) || (iVar27 == 0)) {
            if (uVar8 != 0) {
              lVar17 = 0;
              do {
                *puVar9 = '\x02';
                *(undefined2 *)(puVar9 + 1) = *(undefined2 *)((long)&pvVar22->vocolobj + lVar17);
                puVar9 = puVar9 + 3;
                lVar17 = lVar17 + 0x28;
              } while ((ulong)uVar8 * 0x28 != lVar17);
            }
            goto LAB_001f4fbb;
          }
        }
        pvVar28 = local_1248;
        if ((iVar27 == 0x2d) || (ctx_copy.voccxredo != 0)) {
          local_1260 = (ushort *)((long)piVar12 + 5);
          *puVar9 = '\x03';
          sVar10 = strlen((char *)local_1248);
          *local_1260 = (short)sVar10 + 2;
          memcpy(local_1260 + 1,pvVar28,sVar10 & 0xffffffff);
        }
LAB_001f4fbb:
        ctx_02->voc_stk_cur = (uchar *)pvVar22;
        return;
      }
    }
  }
  ctx_01 = ctx->voccxerr;
LAB_001f503f:
  errsigf(ctx_01,"TADS",0x417);
}

Assistant:

void voc_parse_disambig(voccxdef *ctx)
{
    voccxdef ctx_copy;
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *inlist;
    vocoldef *outlist;
    int objcnt;
    char **cmd;
    char *cmdbuf;
    char *oopsbuf;
    objnum actor;
    objnum verb;
    objnum prep;
    objnum otherobj;
    prpnum defprop;
    prpnum accprop;
    prpnum verprop;
    uchar *tokp;
    uint toksiz;
    uchar *objp;
    uint objsiz;
    uchar *lstp;
    uint lstsiz;
    int tokcnt;
    char *p;
    int i;
    int silent;
    int err;
    int unknown_count;

    /* allocate our stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, outlist);
    VOC_STK_ARRAY(ctx, char,     cmdbuf, VOCBUFSIZ);
    VOC_STK_ARRAY(ctx, char,     oopsbuf, VOCBUFSIZ);

    /* get the actor, verb, prep, and otherobj arguments */
    actor = runpopobj(rcx);
    verb = runpopobj(rcx);
    prep = runpopobjnil(rcx);
    otherobj = runpopobjnil(rcx);

    /* 
     *   get the usage parameter, and use it to select the appropriate
     *   defprop and accprop 
     */
    switch(runpopnum(rcx))
    {
    case VOC_PRO_RESOLVE_DOBJ:
    default:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDDO;
        break;

    case VOC_PRO_RESOLVE_IOBJ:
        defprop = PRP_IODEFAULT;
        accprop = PRP_VALIDIO;
        break;

    case VOC_PRO_RESOLVE_ACTOR:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDACTOR;
        break;
    }
    
    /* get the verprop argument */
    verprop = runpopprp(rcx);

    /* pop the token list, and read and skip the length prefix */
    tokp = runpoplst(rcx);
    toksiz = osrp2(tokp) - 2;
    tokp += 2;

    /* pop the object list, and read and skip the length prefix */
    objp = runpoplst(rcx);
    objsiz = osrp2(objp) - 2;
    objp += 2;

    /* pop the "silent" flag */
    silent = runpoplog(rcx);

    /* count the tokens */
    for (lstp = tokp, lstsiz = toksiz, tokcnt = 0 ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count it */
        if (*lstp == DAT_SSTRING)
            ++tokcnt;
    }

    /* allocate stack space for the command pointers and buffer */
    VOC_STK_ARRAY(ctx, char *, cmd, tokcnt + 1);

    /* extract the tokens into our pointer buffer */
    for (lstp = tokp, lstsiz = toksiz, i = 0, p = cmdbuf ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count and size it */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* store a pointer to the word in the command buffer */
            cmd[i++] = p;

            /* copy the token into the command buffer and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the buffer pointer past this word */
            p += len + 1;
        }
    }

    /* store a null at the end of the command pointer list */
    cmd[i] = 0;

    /*
     *   The object list is provided in the same format as the list
     *   returned by voc_parse_np(), but the leading index number is
     *   optional.  We don't need the leading index for anything, so if
     *   it's there, simply skip it so that we can start with the first
     *   sublist.  
     */
    if (objsiz > 0 && *objp == DAT_NUMBER)
        lstadv(&objp, &objsiz);

    /*
     *   Count the objects in the object list, so that we can figure out
     *   how much we need to allocate for the input object list.  
     */
    for (lstp = objp, lstsiz = objsiz, objcnt = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, count it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                    ++objcnt;

                /* skip this element */
                lstadv(&subp, &subsiz);
            }
        }
    }

    /* allocate space for the input list */
    VOC_STK_ARRAY(ctx, vocoldef, inlist, objcnt + 1);

    /* we don't have any unknown words yet */
    unknown_count = 0;

    /* parse the list, filling in the input array */
    for (lstp = objp, lstsiz = objsiz, i = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;
            int firstwrd, lastwrd;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* in case we don't find token indices, clear them */
            firstwrd = 0;
            lastwrd = 0;

            /* 
             *   the first two elements of the list are the token indices
             *   of the first and last words of this object's noun phrase 
             */
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the first index, adjusting to zero-based indexing */
                firstwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (firstwrd < 0)
                    firstwrd = 0;
                else if (firstwrd > tokcnt)
                    firstwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the last index, adjusting to zero-based indexing */
                lastwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (lastwrd < firstwrd)
                    lastwrd = firstwrd;
                else if (lastwrd > tokcnt)
                    lastwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, store it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                {
                    /* store the object */
                    if (*subp == DAT_OBJECT)
                        inlist[i].vocolobj = osrp2(subp+1);
                    else
                        inlist[i].vocolobj = MCMONINV;

                    /* set the first and last word pointers */
                    inlist[i].vocolfst = cmd[firstwrd];
                    inlist[i].vocollst = cmd[lastwrd];

                    /* skip the object */
                    lstadv(&subp, &subsiz);

                    /* check for flags */
                    if (subsiz > 0 && *subp == DAT_NUMBER)
                    {
                        /* get the flags value */
                        inlist[i].vocolflg = (int)osrp4(subp+1);

                        /* skip the number in the list */
                        lstadv(&subp, &subsiz);
                    }
                    else
                    {
                        /* clear the flags */
                        inlist[i].vocolflg = 0;
                    }

                    /* if an unknown word was involved, note it */
                    if ((inlist[i].vocolflg & VOCS_UNKNOWN) != 0)
                        ++unknown_count;

                    /* consume the element */
                    ++i;
                }
                else
                {
                    /* skip this element */
                    lstadv(&subp, &subsiz);
                }
            }
        }
    }

    /* terminate the list */
    inlist[i].vocolobj = MCMONINV;
    inlist[i].vocolflg = 0;

    /* 
     *   make a copy of our context, so the disambiguation can't make any
     *   global changes 
     */
    memcpy(&ctx_copy, ctx, sizeof(ctx_copy));

    /*
     *   Count the unknown words and set the count in the context.  This
     *   will allow us to determine after we call the resolver whether the
     *   resolution process cleared up the unknown words (via
     *   parseUnknownDobj/Iobj). 
     */
    ctx_copy.voccxunknown = ctx_copy.voccxlastunk = unknown_count;

    /* disambiguate the noun list */
    err = vocdisambig(&ctx_copy, outlist, inlist,
                      defprop, accprop, verprop, cmd,
                      otherobj, actor, verb, prep, cmdbuf, silent);

    /*
     *   If the error was VOCERR(2) - unknown word - check the input list
     *   to see if it contained any unknown words.  If it does, and we're
     *   not in "silent" mode, flag the error and then give the user a
     *   chance to use "oops" to correct the problem.  If we're in silent
     *   mode, don't display an error and don't allow interactive
     *   correction via "oops."
     *   
     *   It is possible that the unknown word is not in the input list,
     *   but in the user's response to an interactive disambiguation
     *   query.  This is why we must check to see if the unknown word is
     *   in the original input list or not.
     */
    if (err == VOCERR(2) && ctx_copy.voccxunknown != 0 && !silent)
    {
        char *unk;
        int unk_idx;
        char *rpl_text;

        /* 
         *   forget we have unknown words, since we're going to handle
         *   them now
         */
        ctx_copy.voccxunknown = 0;

        /* 
         *   find the unknown word - look up each word until we find one
         *   that's not in the dictionary 
         */
        for (i = 0, unk = 0 ; cmd[i] != 0 ; ++i)
        {
            int t;
            
            /* 
             *   get this word's type - if the word has no type, it's an
             *   unknown word 
             */
            t = voc_lookup_type(ctx, cmd[i], strlen(cmd[i]), TRUE);
            if (t == 0)
            {
                /* this is it - note it and stop searching */
                unk_idx = i;
                unk = cmd[i];
                break;
            }
        }

        /* 
         *   if we didn't find any unknown words, assume the first word
         *   was unknown 
         */
        if (unk == 0)
        {
            unk_idx = 0;
            unk = cmd[0];
        }

        /* display an error, and read a new command */
        rpl_text = voc_read_oops(&ctx_copy, oopsbuf, VOCBUFSIZ, unk);

        /* 
         *   if they didn't respond with "oops," treat the response as a
         *   brand new command to replace the current command 
         */
        if (rpl_text == 0)
        {
            /* 
             *   it's a replacement command - set the redo flag to
             *   indicate that we should process the replacement command 
             */
            ctx_copy.voccxredo = TRUE;

            /* copy the response into the command buffer */
            strcpy(cmdbuf, oopsbuf);
        }
        else
        {
            /* indicate the correction via the result code */
            err = VOCERR(45);

            /* 
             *   Build the new command string.  The new command string
             *   consists of all of the tokens up to the unknown token,
             *   then the replacement text, then all of the remaining
             *   tokens. 
             */
            for (p = cmdbuf, i = 0 ; cmd[i] != 0 ; ++i)
            {
                size_t needed;
                
                /* figure the size needs for this token */
                if (i == unk_idx)
                {
                    /* we need to insert the replacement text */
                    needed = strlen(rpl_text);
                }
                else
                {
                    /* we need to insert this token string */
                    needed = strlen(cmd[i]);
                }
                
                /* 
                 *   if more tokens follow, we need a space after the
                 *   replacement text to separate it from what follows 
                 */
                if (cmd[i+1] != 0 && needed != 0)
                    needed += 1;

                /* leave room for null termination */
                needed += 1;

                /* if we don't have room for this token, stop now */
                if (needed > (size_t)(VOCBUFSIZ - (p - cmdbuf)))
                    break;

                /* 
                 *   if we've reached the unknown token, insert the
                 *   replacement text; otherwise, insert this token
                 */
                if (i == unk_idx)
                {
                    /* insert the replacement text */
                    strcpy(p, rpl_text);
                }
                else if (*cmd[i] == '"')
                {
                    char *p1;
                    char qu;
                    
                    /* 
                     *   Scan the quoted string for embedded double quotes
                     *   - if it has any, use single quotes as the
                     *   delimiter; otherwise, use double quotes as the
                     *   delimiter.  Note that we ignore the first and
                     *   last characters in the string, since these are
                     *   always the delimiting double quotes in the
                     *   original token text.  
                     */
                    for (qu = '"', p1 = cmd[i] + 1 ;
                         *p1 != '\0' && *(p1 + 1) != '\0' ; ++p1)
                    {
                        /* check for an embedded double quote */
                        if (*p1 == '"')
                        {
                            /* switch to single quotes as delimiters */
                            qu = '\'';

                            /* no need to look any further */
                            break;
                        }
                    }

                    /* add the open quote */
                    *p++ = qu;

                    /* 
                     *   add the text, leaving out the first and last
                     *   characters (which are the original quotes) 
                     */
                    if (strlen(cmd[i]) > 2)
                    {
                        memcpy(p, cmd[i] + 1, strlen(cmd[i]) - 2);
                        p += strlen(cmd[i]) - 2;
                    }

                    /* add the closing quote */
                    *p++ = qu;

                    /* null-terminate here so we don't skip any further */
                    *p = '\0';
                }
                else
                {
                    /* copy this word */
                    strcpy(p, cmd[i]);
                }

                /* move past this token */
                p += strlen(p);

                /* add a space if another token follows */
                if (cmd[i+1] != 0)
                    *p++ = ' ';
            }

            /* null-terminate the replacement text */
            *p = '\0';
        }
    }

    /* 
     *   Count the objects.  An object list is returned only on success or
     *   VOCERR(44), which indicates that the list is still ambiguous. 
     */
    if (err == 0 || err == VOCERR(44))
    {
        /* count the objects in the list */
        for (i = 0 ; outlist[i].vocolobj != MCMONINV ; ++i) ;
        objcnt = i;
    }
    else
    {
        /* there's nothing in the list */
        objcnt = 0;
    }

    /* figure out how much space we need for the objects */
    lstsiz = (1+2) * objcnt;
        
    /* add space for the first element, which contains the status code */
    lstsiz += (1 + 4);

    /* if there's a new command string, we'll store it, so make room */
    if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        /* 
         *   add space for the type prefix (1), length prefix (2), and the
         *   string bytes (with no null terminator, of course) 
         */
        lstsiz += (1 + 2 + strlen(cmdbuf));

        /* 
         *   if we're retrying due to the redo flag, always return the
         *   RETRY error code, regardless of what caused us to retry the
         *   command 
         */
        if (ctx_copy.voccxredo)
            err = VOCERR(43);
    }

    /* push a list with space for the objects */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* store the status code in the first element */
    *lstp++ = DAT_NUMBER;
    oswp4s(lstp, err);
    lstp += 4;

    /* store the remainder of the list */
    if (err == 0 || err == VOCERR(44))
    {
        /* fill in the list with the objects */
        for (i = 0 ; i < objcnt ; ++i)
        {
            /* set this element */
            *lstp++ = DAT_OBJECT;
            oswp2(lstp, outlist[i].vocolobj);
            lstp += 2;
        }
    }
    else if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        uint len;
        
        /* there's a new command - return it as the second element */
        *lstp++ = DAT_SSTRING;

        /* store the length */
        len = strlen(cmdbuf);
        oswp2(lstp, len + 2);
        lstp += 2;

        /* store the string */
        memcpy(lstp, cmdbuf, len);
    }

    /* leave the stack frame */
    voc_leave(ctx, save_sp);
}